

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int init_mixw(float32 **mixw,vector_t **mean,uint32 n_density,uint32 *veclen,uint32 n_frame,
             uint32 n_stream,codew_t *label)

{
  int *piVar1;
  float32 *pfVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  pvVar3 = __ckd_calloc__((ulong)n_density,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                          ,0x36b);
  if (n_stream != 0) {
    uVar4 = 0;
    do {
      if (n_frame != 0) {
        uVar5 = 0;
        do {
          piVar1 = (int *)((long)pvVar3 + (ulong)label[uVar5] * 4);
          *piVar1 = *piVar1 + 1;
          uVar5 = uVar5 + 1;
        } while (n_frame != uVar5);
      }
      if (n_density != 0) {
        pfVar2 = mixw[uVar4];
        uVar5 = 0;
        do {
          pfVar2[uVar5] = (float32)((float)*(uint *)((long)pvVar3 + uVar5 * 4) / (float)n_frame);
          uVar5 = uVar5 + 1;
        } while (n_density != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != n_stream);
  }
  return 0;
}

Assistant:

int
init_mixw(float32 **mixw,
	  vector_t **mean,
	  uint32 n_density,
	  const uint32 *veclen,
	  uint32 n_frame,
	  uint32 n_stream,
	  codew_t *label)
{
    uint32 s;
    uint32 *occ_cnt;
    uint32 i;

    occ_cnt = ckd_calloc(n_density, sizeof(uint32));

    for (s = 0; s < n_stream; s++) {
	for (i = 0; i < n_frame; i++) {
	    occ_cnt[label[i]]++;
	}

	for (i = 0; i < n_density; i++) {
	    mixw[s][i] = (float32)occ_cnt[i] / (float32)n_frame;
	}
    }
    return 0;
}